

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O3

boolean hits_bars(obj **obj_p,int x,int y,int dx,int dy,int always_hit,int whodidit)

{
  byte bVar1;
  ushort uVar2;
  obj *poVar3;
  boolean bVar4;
  char cVar5;
  bool bVar6;
  
  cVar5 = (char)always_hit;
  if ((char)always_hit != '\0') goto switchD_001f615d_caseD_a;
  poVar3 = *obj_p;
  bVar4 = '\0';
  if (0xe < (byte)poVar3->oclass - 2) {
    return '\0';
  }
  uVar2 = poVar3->otyp;
  cVar5 = '\x01';
  switch((uint)(byte)poVar3->oclass) {
  case 2:
    bVar1 = objects[(short)uVar2].oc_subtyp;
    if ((bVar1 - 0xe6 < 5) && (bVar1 - 0xe6 != 3)) {
      return '\0';
    }
    if (bVar1 - 0x12 < 2) {
      return '\0';
    }
    bVar6 = bVar1 == 2;
    goto LAB_001f623d;
  case 3:
    bVar6 = objects[(short)uVar2].oc_subtyp == '\x03';
    goto LAB_001f623d;
  default:
    goto switchD_001f615d_caseD_4;
  case 6:
    if ((uVar2 - 0xe2 < 0x19) && ((0x100081fU >> (uVar2 - 0xe2 & 0x1f) & 1) != 0)) {
      return '\0';
    }
    bVar6 = uVar2 == 0xfb;
LAB_001f623d:
    cVar5 = !bVar6;
    break;
  case 7:
    if ((uVar2 != 0x10e) || (mons[poVar3->corpsenm].msize == '\0')) {
      cVar5 = (ushort)(uVar2 - 0x111) < 2;
    }
    break;
  case 10:
  case 0xb:
  case 0xf:
  case 0x10:
    break;
  case 0xe:
    if ((uVar2 == 0x215) && (mons[poVar3->corpsenm].msize == '\0')) {
      return '\0';
    }
  }
switchD_001f615d_caseD_a:
  bVar4 = cVar5;
  if ((whodidit != -1) && (bVar4 != '\0')) {
    hit_bars(obj_p,x,y,dx + x,dy + y,whodidit != 0,'\0');
  }
switchD_001f615d_caseD_4:
  return bVar4;
}

Assistant:

boolean hits_bars(struct obj **obj_p,	/* *obj_p will be set to NULL if object breaks */
		  int x, int y, int dx, int dy,
		  int always_hit,	/* caller can force a hit for items which would fit through */
		  int whodidit)	/* 1==hero, 0=other, -1==just check whether it'll pass thru */
{
    struct obj *otmp = *obj_p;
    int obj_type = otmp->otyp;
    boolean hits = always_hit;

    if (!hits)
	switch (otmp->oclass) {
	case WEAPON_CLASS:
	    {
		int oskill = objects[obj_type].oc_skill;

		hits = (oskill != -P_BOW  && oskill != -P_CROSSBOW &&
			oskill != -P_DART && oskill != -P_SHURIKEN &&
			oskill != P_SPEAR && oskill != P_JAVELIN &&
			oskill != P_KNIFE);	/* but not dagger */
		break;
	    }
	case ARMOR_CLASS:
		hits = (objects[obj_type].oc_armcat != ARM_GLOVES);
		break;
	case TOOL_CLASS:
		hits = (obj_type != SKELETON_KEY &&
			obj_type != LOCK_PICK &&
			obj_type != CREDIT_CARD &&
			obj_type != TALLOW_CANDLE &&
			obj_type != WAX_CANDLE &&
			obj_type != LENSES &&
			obj_type != TIN_WHISTLE &&
			obj_type != MAGIC_WHISTLE);
		break;
	case ROCK_CLASS:	/* includes boulder */
		if (obj_type != STATUE ||
			mons[otmp->corpsenm].msize > MZ_TINY) hits = TRUE;
		break;
	case FOOD_CLASS:
		if (obj_type == CORPSE &&
			mons[otmp->corpsenm].msize > MZ_TINY) hits = TRUE;
		else
		    hits = (obj_type == MEAT_STICK ||
			    obj_type == HUGE_CHUNK_OF_MEAT);
		break;
	case SPBOOK_CLASS:
	case WAND_CLASS:
	case BALL_CLASS:
	case CHAIN_CLASS:
		hits = TRUE;
		break;
	default:
		break;
	}

    if (hits && whodidit != -1) {
	hit_bars(obj_p, x, y, x + dx, y + dy, !!whodidit, FALSE);
    }

    return hits;
}